

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_assert(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *o;
  SQRESULT SVar2;
  SQChar *local_28;
  SQChar *str;
  SQInteger top;
  HSQUIRRELVM v_local;
  
  top = (SQInteger)v;
  o = stack_get(v,2);
  bVar1 = SQVM::IsFalse(o);
  if (bVar1) {
    str = (SQChar *)sq_gettop((HSQUIRRELVM)top);
    if ((2 < (long)str) && (SVar2 = sq_tostring((HSQUIRRELVM)top,3), -1 < SVar2)) {
      local_28 = (SQChar *)0x0;
      SVar2 = sq_getstring((HSQUIRRELVM)top,-1,&local_28);
      if (-1 < SVar2) {
        SVar2 = sq_throwerror((HSQUIRRELVM)top,local_28);
        return SVar2;
      }
    }
    v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)top,"assertion failed");
  }
  else {
    v_local = (HSQUIRRELVM)0x0;
  }
  return (SQInteger)v_local;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        SQInteger top = sq_gettop(v);
        if (top>2 && SQ_SUCCEEDED(sq_tostring(v,3))) {
            const SQChar *str = 0;
            if (SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
                return sq_throwerror(v, str);
            }
        }
        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}